

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::ConvertToWindowsOutputPath(string *__return_storage_ptr__,string *path)

{
  long lVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2f);
    if (lVar1 == -1) break;
    (__return_storage_ptr__->_M_dataplus)._M_p[lVar1] = '\\';
  }
  if ((1 < __return_storage_ptr__->_M_string_length) &&
     ((uVar2 = 1, *(__return_storage_ptr__->_M_dataplus)._M_p != '\"' ||
      (uVar2 = 2, __return_storage_ptr__->_M_string_length != 2)))) {
    while (uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x1150ac,uVar2),
          uVar2 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar2);
    }
    lVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0x20);
    if ((lVar1 != -1) && (*(__return_storage_ptr__->_M_dataplus)._M_p != '\"')) {
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x01');
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::ConvertToWindowsOutputPath(const kwsys_stl::string& path)
{
  kwsys_stl::string ret;
  // make it big enough for all of path and double quotes
  ret.reserve(path.size()+3);
  // put path into the string
  ret = path;
  kwsys_stl::string::size_type pos = 0;
  // first convert all of the slashes
  while((pos = ret.find('/', pos)) != kwsys_stl::string::npos)
    {
    ret[pos] = '\\';
    pos++;
    }
  // check for really small paths
  if(ret.size() < 2)
    {
    return ret;
    }
  // now clean up a bit and remove double slashes
  // Only if it is not the first position in the path which is a network
  // path on windows
  pos = 1; // start at position 1
  if(ret[0] == '\"')
    {
    pos = 2;  // if the string is already quoted then start at 2
    if(ret.size() < 3)
      {
      return ret;
      }
    }
  while((pos = ret.find("\\\\", pos)) != kwsys_stl::string::npos)
    {
    ret.erase(pos, 1);
    }
  // now double quote the path if it has spaces in it
  // and is not already double quoted
  if(ret.find(' ') != kwsys_stl::string::npos
     && ret[0] != '\"')
    {
    ret.insert(static_cast<kwsys_stl::string::size_type>(0),
               static_cast<kwsys_stl::string::size_type>(1), '\"');
    ret.append(1, '\"');
    }
  return ret;
}